

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.hxx
# Opt level: O2

void printhelp(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"  ");
  poVar1 = std::operator<<(poVar1,program_name);
  poVar1 = std::operator<<(poVar1," [options] file");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Options:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "  -i LIBRARY, --ignore=LIBRARY\tIgnore a specific library.");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,
                  "  -I TEXT, --ignore-text=TEXT\tIgnore libraries when their path ");
  poVar1 = std::operator<<((ostream *)&std::cout,"contains the text.");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"  -e FILE, --image=FILE\t\tExport image file.");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"  -f FORMAT, --image-format=FORMAT");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"\t\t\t\tOutput image format. ");
  poVar1 = std::operator<<((ostream *)&std::cout,"Use \'dot -T?\' for a complete list.");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"  -g FILE, --graphviz\t\tExport Graphviz diagram."
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"  -t, --trace-loaded-objects\tUse LD_TRACE_LOADED_OBJECTS "
                 );
  poVar1 = std::operator<<((ostream *)&std::cout,"instead of ldd.");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"  -q, --quiet\t\t\tQuiet mode.");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"  -V, --verbose\t\t\tVerbose mode.");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"  -h, --help\t\t\tPrint this message and exit.");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"  -v, --version\t\t\tPrint the version number of ");
  poVar1 = std::operator<<((ostream *)&std::cout,program_name);
  poVar1 = std::operator<<(poVar1," and exit.");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<(poVar1,"lddgraph ");
  poVar1 = std::operator<<(poVar1,"d42c718");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Copyright (C) 2012 Baptist BENOIST");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<(poVar1,"For bug reporting instructions, please see:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"<https://github.com/bbenoist/lddgraph/issues>");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

static inline void printhelp()
{
  cout << "Usage:" << endl;
  cout << "  " << program_name << " [options] file" << endl;
  cout << "Options:" << endl;
  cout << "  -i LIBRARY, --ignore=LIBRARY\tIgnore a specific library." << endl;
  cout << "  -I TEXT, --ignore-text=TEXT\tIgnore libraries when their path ";
  cout << "contains the text." << endl;
  cout << "  -e FILE, --image=FILE\t\tExport image file." << endl;
  cout << "  -f FORMAT, --image-format=FORMAT" << endl;
  cout << "\t\t\t\tOutput image format. ";
  cout << "Use 'dot -T?' for a complete list." << endl;
  cout << "  -g FILE, --graphviz\t\tExport Graphviz diagram." << endl;
  cout << "  -t, --trace-loaded-objects\tUse LD_TRACE_LOADED_OBJECTS ";
  cout << "instead of ldd." << endl;
  cout << "  -q, --quiet\t\t\tQuiet mode." << endl;
  cout << "  -V, --verbose\t\t\tVerbose mode." << endl;
  cout << "  -h, --help\t\t\tPrint this message and exit." << endl;
  cout << "  -v, --version\t\t\tPrint the version number of ";
  cout << program_name << " and exit." << endl;
  cout << endl << "lddgraph " << LDDGRAPH_VERSION << endl;
  cout << LDDGRAPH_COPYRIGHT << endl;
  cout << endl << "For bug reporting instructions, please see:" << endl;
  cout << "<https://github.com/bbenoist/lddgraph/issues>" << endl;
}